

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  string_view needle;
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  FileOptions *pFVar4;
  string *psVar5;
  LogMessage *pLVar6;
  char *pcVar7;
  char needle_00;
  undefined1 auVar8 [16];
  string_view haystack;
  string_view name;
  string_view local_1b0;
  undefined1 local_1a0 [16];
  string local_190;
  string local_170 [32];
  string local_150 [32];
  undefined1 local_130 [8];
  string component;
  size_t dot_index;
  size_t delimiter_size;
  string local_f8 [8];
  string delimiter;
  string_view local_d0;
  string local_c0 [40];
  LogMessage local_98;
  Voidify local_81;
  undefined1 local_80 [16];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string_view local_60;
  string local_40 [8];
  string package_name;
  bool need_change_to_module;
  int levels;
  Printer *printer_local;
  FileDescriptor *file_local;
  
  package_name.field_2._12_4_ = 0;
  package_name.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string(local_40);
  pFVar4 = FileDescriptor::options(file);
  bVar2 = FileOptions::has_ruby_package(pFVar4);
  if (bVar2) {
    pFVar4 = FileDescriptor::options(file);
    psVar5 = FileOptions::ruby_package_abi_cxx11_(pFVar4);
    std::__cxx11::string::operator=(local_40,(string *)psVar5);
    local_60 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"::");
    needle._M_str = local_70._M_str;
    needle._M_len = local_70._M_len;
    bVar2 = absl::lts_20250127::StrContains(local_60,needle);
    needle_00 = (char)local_70._M_str;
    if (bVar2) {
      package_name.field_2._M_local_buf[0xb] = '\0';
    }
    else {
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
      haystack._M_str = (char *)0x2e;
      haystack._M_len = local_80._8_8_;
      bVar2 = absl::lts_20250127::StrContains(local_80._0_8_,haystack,needle_00);
      if (bVar2) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                   ,0xac);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar6,(char (*) [46])"ruby_package option should be in the form of:");
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar6,(char (*) [27])" \'A::B::C\' and not \'A.B.C\'");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar6);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_98);
      }
    }
  }
  else {
    local_d0 = FileDescriptor::package(file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_c0,&local_d0,(allocator<char> *)(delimiter.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator=(local_40,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)(delimiter.field_2._M_local_buf + 0xf));
  }
  pcVar7 = "::";
  if ((package_name.field_2._M_local_buf[0xb] & 1U) != 0) {
    pcVar7 = ".";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,pcVar7,(allocator<char> *)((long)&delimiter_size + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&delimiter_size + 7));
  pcVar7 = (char *)0x1;
  while( true ) {
    bVar3 = std::__cxx11::string::empty();
    uVar1 = package_name.field_2._12_4_;
    if (((bVar3 ^ 0xff) & 1) == 0) break;
    component.field_2._8_8_ = std::__cxx11::string::find(local_40,(ulong)local_f8);
    std::__cxx11::string::string((string *)local_130);
    if (component.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=((string *)local_130,local_40);
      std::__cxx11::string::operator=(local_40,anon_var_dwarf_37cdd0 + 5);
    }
    else {
      std::__cxx11::string::substr((ulong)local_150,(ulong)local_40);
      std::__cxx11::string::operator=((string *)local_130,local_150);
      std::__cxx11::string::~string(local_150);
      pcVar7 = (char *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)local_170,(ulong)local_40);
      std::__cxx11::string::operator=(local_40,local_170);
      std::__cxx11::string::~string(local_170);
    }
    if ((package_name.field_2._M_local_buf[0xb] & 1U) != 0) {
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      name._M_len = auVar8._8_8_;
      name._M_str = pcVar7;
      local_1a0 = auVar8;
      PackageToModule_abi_cxx11_(&local_190,auVar8._0_8_,name);
      std::__cxx11::string::operator=((string *)local_130,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1b0,"module $name$\n");
    pcVar7 = "name";
    protobuf::io::Printer::Print<char[5],std::__cxx11::string>
              (printer,local_1b0,(char (*) [5])0x1d1c66d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    protobuf::io::Printer::Indent(printer);
    package_name.field_2._12_4_ = package_name.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)local_130);
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_40);
  return uVar1;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (absl::StrContains(package_name, "::")) {
      need_change_to_module = false;
    } else if (absl::StrContains(package_name, '.')) {
      ABSL_LOG(WARNING) << "ruby_package option should be in the form of:"
                        << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = std::string(file->package());
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  size_t delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print("module $name$\n", "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}